

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int GetSubRects(WebPPicture *prev_canvas,WebPPicture *curr_canvas,int is_key_frame,
               int is_first_frame,float quality,SubFrameParams *params)

{
  int iVar1;
  long in_RSI;
  FrameRectangle *in_RDI;
  WebPPicture *in_R8;
  undefined4 in_XMM0_Da;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  in_R8->width = 0;
  in_R8->height = 0;
  *(undefined4 *)&in_R8->y = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)((long)&in_R8->y + 4) = *(undefined4 *)(in_RSI + 0xc);
  iVar1 = GetSubRect((WebPPicture *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),in_R8,
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (int)((ulong)&in_R8->u >> 0x20),(int)&in_R8->u,
                     (float)((ulong)&in_R8->width >> 0x20),in_RDI,
                     (WebPPicture *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    in_R8[1].u = *(uint8_t **)&in_R8->width;
    in_R8[1].v = in_R8->y;
    iVar1 = GetSubRect((WebPPicture *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd8),in_R8,
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                       (int)((ulong)&in_R8[1].y_stride >> 0x20),(int)&in_R8[1].y_stride,
                       (float)((ulong)&in_R8[1].u >> 0x20),in_RDI,
                       (WebPPicture *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
  }
  return iVar1;
}

Assistant:

static int GetSubRects(const WebPPicture* const prev_canvas,
                       const WebPPicture* const curr_canvas, int is_key_frame,
                       int is_first_frame, float quality,
                       SubFrameParams* const params) {
  // Lossless frame rectangle.
  params->rect_ll_.x_offset_ = 0;
  params->rect_ll_.y_offset_ = 0;
  params->rect_ll_.width_ = curr_canvas->width;
  params->rect_ll_.height_ = curr_canvas->height;
  if (!GetSubRect(prev_canvas, curr_canvas, is_key_frame, is_first_frame,
                  params->empty_rect_allowed_, 1, quality,
                  &params->rect_ll_, &params->sub_frame_ll_)) {
    return 0;
  }
  // Lossy frame rectangle.
  params->rect_lossy_ = params->rect_ll_;  // seed with lossless rect.
  return GetSubRect(prev_canvas, curr_canvas, is_key_frame, is_first_frame,
                    params->empty_rect_allowed_, 0, quality,
                    &params->rect_lossy_, &params->sub_frame_lossy_);
}